

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf-test.cc
# Opt level: O0

void __thiscall PrintfTest_NoArgs_Test::TestBody(PrintfTest_NoArgs_Test *this)

{
  string_view format;
  undefined1 uVar1;
  undefined1 uVar2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  char *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  char (*in_stack_ffffffffffffff28) [5];
  wchar_t *expected;
  char *in_stack_ffffffffffffff30;
  wstring *actual_expression;
  char *in_stack_ffffffffffffff38;
  int line;
  undefined7 in_stack_ffffffffffffff40;
  Type type;
  AssertHelper *this_00;
  wchar_t (*in_stack_ffffffffffffff58) [5];
  wstring local_98 [32];
  AssertionResult local_78;
  Message *in_stack_ffffffffffffff98;
  AssertHelper *in_stack_ffffffffffffffa0;
  AssertHelper local_38 [4];
  AssertionResult local_18;
  
  type = kSuccess;
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),in_stack_ffffffffffffff18
            );
  this_00 = local_38;
  format.data_._7_1_ = in_stack_ffffffffffffff27;
  format.data_._0_7_ = in_stack_ffffffffffffff20;
  format.size_ = (size_t)in_stack_ffffffffffffff28;
  test_sprintf<>(format);
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
  std::__cxx11::string::~string((string *)local_38);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!(bool)uVar1) {
    testing::Message::Message((Message *)this_00);
    in_stack_ffffffffffffff38 =
         testing::AssertionResult::failure_message((AssertionResult *)0x1118db);
    testing::internal::AssertHelper::AssertHelper
              (this_00,type,(char *)CONCAT17(uVar1,in_stack_ffffffffffffff40),
               (int)((ulong)in_stack_ffffffffffffff38 >> 0x20),in_stack_ffffffffffffff30);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
    testing::Message::~Message((Message *)0x111938);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11198d);
  expected = L"test";
  actual_expression = local_98;
  fmt::v5::sprintf<wchar_t[5]>(in_stack_ffffffffffffff58);
  testing::internal::EqHelper<false>::Compare<wchar_t[5],std::__cxx11::wstring>
            (in_stack_ffffffffffffff38,(char *)actual_expression,(wchar_t (*) [5])expected,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
  line = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  std::__cxx11::wstring::~wstring(local_98);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_78);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)this_00);
    testing::AssertionResult::failure_message((AssertionResult *)0x111a59);
    testing::internal::AssertHelper::AssertHelper
              (this_00,type,(char *)CONCAT17(uVar1,in_stack_ffffffffffffff40),line,
               (char *)actual_expression);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar2,in_stack_ffffffffffffff20));
    testing::Message::~Message((Message *)0x111aa5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x111af1);
  return;
}

Assistant:

TEST(PrintfTest, NoArgs) {
  EXPECT_EQ("test", test_sprintf("test"));
  EXPECT_EQ(L"test", fmt::sprintf(L"test"));
}